

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall DIntermissionScreenCast::Drawer(DIntermissionScreenCast *this)

{
  FState *pFVar1;
  AActor *pAVar2;
  PClassPlayerPawn *pPVar3;
  FTexture *img;
  FFont *font;
  DFrameBuffer *this_00;
  undefined8 *puVar4;
  int iVar5;
  BYTE *string;
  int iVar6;
  undefined8 *puVar7;
  PClassPlayerPawn *pPVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  string = (BYTE *)this->mName;
  if (string != (BYTE *)0x0) {
    if (*string == '$') {
      string = (BYTE *)FStringTable::operator()(&GStrings,(char *)(string + 1));
    }
    this_00 = screen;
    font = SmallFont;
    iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    iVar5 = FFont::StringWidth(SmallFont,string);
    DCanvas::DrawText((DCanvas *)this_00,font,0xb,(iVar6 - iVar5 * CleanXfac) / 2,
                      ((screen->super_DSimpleCanvas).super_DCanvas.Height * 0xb4) / 200,
                      (char *)string,0x40001393,1,0);
  }
  pFVar1 = this->caststate;
  if (pFVar1 == (FState *)0x0) {
    return;
  }
  pAVar2 = this->mDefaults;
  dVar10 = (pAVar2->Scale).X;
  dVar11 = (pAVar2->Scale).Y;
  iVar6 = pFVar1->sprite;
  if (((((pAVar2->flags4).Value & 0x20) == 0) && (pAVar2->SpawnState != (FState *)0x0)) &&
     (iVar6 == pAVar2->SpawnState->sprite)) {
    pPVar3 = (PClassPlayerPawn *)this->mClass;
    pPVar8 = pPVar3;
    if (pPVar3 != (PClassPlayerPawn *)APlayerPawn::RegistrationInfo.MyClass) {
      do {
        pPVar8 = (PClassPlayerPawn *)(pPVar8->super_PClassActor).super_PClass.ParentClass;
        if (pPVar8 == (PClassPlayerPawn *)APlayerPawn::RegistrationInfo.MyClass) break;
      } while (pPVar8 != (PClassPlayerPawn *)0x0);
      if (pPVar8 == (PClassPlayerPawn *)0x0) goto LAB_00303526;
    }
    if ((skins != (FPlayerSkin *)0x0) && ((ulong)PlayerClasses.Count != 0)) {
      uVar9 = 0;
      do {
        if (PlayerClasses.Array[uVar9].Type == pPVar3) {
          puVar4 = (undefined8 *)
                   ((ulong)(((&DAT_017e1e88)[(long)consoleplayer * 0xa8] - 1 & 0x208) * 0x18) +
                   (&DAT_017e1e78)[(long)consoleplayer * 0x54]);
          do {
            puVar7 = puVar4;
            puVar4 = (undefined8 *)*puVar7;
          } while (*(int *)(puVar7 + 1) != 0x208);
          iVar6 = skins[*(int *)(puVar7[2] + 0x28)].sprite;
          dVar10 = skins[*(int *)(puVar7[2] + 0x28)].Scale.X;
          dVar11 = skins[*(int *)(puVar7[2] + 0x28)].Scale.Y;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != PlayerClasses.Count);
    }
  }
LAB_00303526:
  uVar9 = (ulong)((uint)sprites.Array[iVar6].spriteframes * 0x50);
  img = TexMan.Textures.Array
        [TexMan.Translation.Array
         [*(int *)((long)&(SpriteFrames.Array)->Texture[0].texnum +
                  uVar9 + (uint)pFVar1->Frame * 0x50)]].Texture;
  DCanvas::DrawTexture
            ((DCanvas *)screen,img,160.0,170.0,0x40001391,
             (dVar11 * (double)img->Height) / (img->Scale).Y,
             ((double)img->Width * dVar10) / (img->Scale).X,pAVar2->Alpha,1,0x40001395,
             (ulong)(*(ushort *)
                      ((long)((SpriteFrames.Array)->Texture + 0x10) +
                      uVar9 + (uint)pFVar1->Frame * 0x50) & 1),0x400013b0,0x400013af,0x400013a9,
             (ulong)(pAVar2->RenderStyle).AsDWORD,0x4000138c,0x4000138e,this->casttranslation,0);
  return;
}

Assistant:

void DIntermissionScreenCast::Drawer ()
{
	spriteframe_t*		sprframe;
	FTexture*			pic;

	Super::Drawer();

	const char *name = mName;
	if (name != NULL)
	{
		if (*name == '$') name = GStrings(name+1);
		screen->DrawText (SmallFont, CR_UNTRANSLATED,
			(SCREENWIDTH - SmallFont->StringWidth (name) * CleanXfac)/2,
			(SCREENHEIGHT * 180) / 200,
			name,
			DTA_CleanNoMove, true, TAG_DONE);
	}

	// draw the current frame in the middle of the screen
	if (caststate != NULL)
	{
		DVector2 castscale = mDefaults->Scale;

		int castsprite = caststate->sprite;

		if (!(mDefaults->flags4 & MF4_NOSKIN) &&
			mDefaults->SpawnState != NULL && caststate->sprite == mDefaults->SpawnState->sprite &&
			mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)) &&
			skins != NULL)
		{
			// Only use the skin sprite if this class has not been removed from the
			// PlayerClasses list.
			for (unsigned i = 0; i < PlayerClasses.Size(); ++i)
			{
				if (PlayerClasses[i].Type == mClass)
				{
					FPlayerSkin *skin = &skins[players[consoleplayer].userinfo.GetSkin()];
					castsprite = skin->sprite;

					if (!(mDefaults->flags4 & MF4_NOSKIN))
					{
						castscale = skin->Scale;
					}

				}
			}
		}

		sprframe = &SpriteFrames[sprites[castsprite].spriteframes + caststate->GetFrame()];
		pic = TexMan(sprframe->Texture[0]);

		screen->DrawTexture (pic, 160, 170,
			DTA_320x200, true,
			DTA_FlipX, sprframe->Flip & 1,
			DTA_DestHeightF, pic->GetScaledHeightDouble() * castscale.Y,
			DTA_DestWidthF, pic->GetScaledWidthDouble() * castscale.X,
			DTA_RenderStyle, mDefaults->RenderStyle,
			DTA_AlphaF, mDefaults->Alpha,
			DTA_Translation, casttranslation,
			TAG_DONE);
	}
}